

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.h
# Opt level: O2

void __thiscall ReferenceMeaning::Dump(ReferenceMeaning *this,ostream *out)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,"(meaning-ref ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,")");
  return;
}

Assistant:

void Dump(std::ostream &out) override {
    out << "(meaning-ref " << up_index << " " << right_index << ")";
  }